

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int kmp_get_blocktime_(void)

{
  int iVar1;
  kmp_team_p *pkVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = __kmp_get_global_thread_id_reg();
  iVar1 = *(int *)(__kmp_threads[iVar3]->th_pad + 0x20);
  iVar4 = 0x7fffffff;
  if (__kmp_dflt_blocktime != 0x7fffffff) {
    pkVar2 = (__kmp_threads[iVar3]->th).th_team;
    if ((__kmp_zero_bt == 0) ||
       (((((pkVar2->t).t_threads[iVar1]->th).th_current_task)->td_icvs).bt_set != '\0')) {
      iVar4 = ((((pkVar2->t).t_threads[iVar1]->th).th_current_task)->td_icvs).blocktime;
    }
    else {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int FTN_STDCALL FTN_GET_BLOCKTIME(void) {
#ifdef KMP_STUB
  return __kmps_get_blocktime();
#else
  int gtid, tid;
  kmp_info_t *thread;
  kmp_team_p *team;

  gtid = __kmp_entry_gtid();
  tid = __kmp_tid_from_gtid(gtid);
  thread = __kmp_thread_from_gtid(gtid);
  team = __kmp_threads[gtid]->th.th_team;

  /* These must match the settings used in __kmp_wait_sleep() */
  if (__kmp_dflt_blocktime == KMP_MAX_BLOCKTIME) {
    KF_TRACE(10, ("kmp_get_blocktime: T#%d(%d:%d), blocktime=%d\n", gtid,
                  team->t.t_id, tid, KMP_MAX_BLOCKTIME));
    return KMP_MAX_BLOCKTIME;
  }
#ifdef KMP_ADJUST_BLOCKTIME
  else if (__kmp_zero_bt && !get__bt_set(team, tid)) {
    KF_TRACE(10, ("kmp_get_blocktime: T#%d(%d:%d), blocktime=%d\n", gtid,
                  team->t.t_id, tid, 0));
    return 0;
  }
#endif /* KMP_ADJUST_BLOCKTIME */
  else {
    KF_TRACE(10, ("kmp_get_blocktime: T#%d(%d:%d), blocktime=%d\n", gtid,
                  team->t.t_id, tid, get__blocktime(team, tid)));
    return get__blocktime(team, tid);
  }
#endif
}